

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx_main.cpp
# Opt level: O1

int __thiscall ktx::Tools::main(Tools *this,int argc,char **argv)

{
  uint *puVar1;
  uint uVar2;
  OptionAdder *pOVar3;
  OptionValue *this_00;
  bool *pbVar4;
  size_t sVar5;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 testrun;
  int iVar6;
  Tools *pTVar7;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_00;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_01;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_02;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_03;
  string_view fmt;
  format_args args_04;
  ParseResult args;
  Options options;
  uint *local_558;
  pointer local_550;
  uint local_548;
  undefined4 uStack_544;
  element_type *local_538;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_530;
  element_type *local_528;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_520;
  element_type *local_518;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_510;
  string local_508;
  string local_4e8;
  string local_4c8;
  shared_ptr<const_cxxopts::Value> local_4a8;
  shared_ptr<const_cxxopts::Value> local_498;
  shared_ptr<const_cxxopts::Value> local_488;
  Tools *local_470;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 auStack_448 [16];
  _Alloc_hider local_438;
  pointer pKStack_430;
  undefined1 local_428 [16];
  _Alloc_hider _Stack_418;
  __node_base local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_408;
  _Alloc_hider _Stack_3f8;
  __node_base_ptr local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  __node_base local_3d8;
  size_type sStack_3d0;
  _Prime_rehash_policy local_3c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b8 [2];
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  undefined1 local_2e8 [20];
  undefined4 uStack_2d4;
  undefined8 uStack_2d0;
  _Prime_rehash_policy local_2c8;
  __node_base_ptr local_2b8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_2b0;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_278;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> vStack_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  long *local_230 [2];
  long local_220 [2];
  undefined1 local_210 [56];
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1d8;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_1a0;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  undefined1 local_158 [129];
  bool local_d7;
  size_t local_d0;
  Options *local_c0;
  char local_b0 [128];
  
  local_470 = this;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"ktx","");
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"");
  cxxopts::Options::Options((Options *)local_158,&local_308,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"[<command>] [OPTION...]","");
  std::__cxx11::string::operator=((string *)(local_158 + 0x40),(string *)local_230);
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  local_d0 = 100;
  local_558 = &local_548;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"");
  uVar2 = local_548;
  local_458._0_8_ = local_550;
  puVar1 = (uint *)(local_2e8 + 0x10);
  local_2e8._0_8_ = puVar1;
  if (local_558 != &local_548) {
    local_2e8._0_8_ = local_558;
  }
  uStack_2d4 = uStack_544;
  local_2e8._16_4_ = local_548;
  local_2e8._8_8_ = local_550;
  local_550 = (pointer)0x0;
  local_548 = local_548 & 0xffffff00;
  local_468._8_8_ = local_458 + 8;
  if ((uint *)local_2e8._0_8_ == puVar1) {
    local_458._8_8_ = CONCAT44(uStack_544,uVar2);
  }
  else {
    local_468._8_8_ = local_2e8._0_8_;
    local_458._8_8_ = stack0xfffffffffffffd28;
  }
  local_558 = &local_548;
  local_468._0_8_ = (Options *)local_158;
  local_2e8._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"h,help","");
  local_210._0_8_ = local_210 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_210,"Print this usage message and exit","");
  cxxopts::value<bool>();
  local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_518;
  local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_510;
  local_518 = (element_type *)0x0;
  p_Stack_510 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"");
  pOVar3 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_468,(string *)local_2e8,(string *)local_210,&local_488,
                      &local_4c8);
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"v,version","");
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_508,"Print the version number of this program and exit","");
  cxxopts::value<bool>();
  local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_528;
  local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_520;
  local_528 = (element_type *)0x0;
  p_Stack_520 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"");
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_4e8,&local_508,&local_498,&local_348);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"testrun","");
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,
             "Indicates test run. If enabled the tool will produce deterministic output whenever possible"
             ,"");
  cxxopts::value<bool>();
  local_4a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_538;
  local_4a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_530;
  local_538 = (element_type *)0x0;
  p_Stack_530 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
  cxxopts::OptionAdder::operator()(pOVar3,&local_368,&local_388,&local_4a8,&local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if (local_4a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_530 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_530);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if (local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_520 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_520);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  if (local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_510);
  }
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
    operator_delete((void *)local_2e8._0_8_,stack0xfffffffffffffd28 + 1);
  }
  if ((undefined1 *)local_468._8_8_ != local_458 + 8) {
    operator_delete((void *)local_468._8_8_,local_458._8_8_ + 1);
  }
  if (local_558 != &local_548) {
    operator_delete(local_558,CONCAT44(uStack_544,local_548) + 1);
  }
  local_468._8_8_ = local_b0;
  local_d7 = true;
  local_2e8._0_8_ = &local_2b8;
  stack0xfffffffffffffd28 = 0;
  uStack_2d0 = 0;
  local_2e8._8_8_ = 1;
  local_2c8._M_max_load_factor = 1.0;
  local_2c8._4_4_ = 0;
  local_2b0._M_buckets = &local_2b0._M_single_bucket;
  local_2c8._M_next_resize = 0;
  local_2b8 = (__node_base_ptr)0x0;
  local_2b0._M_bucket_count = 1;
  local_2b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2b0._M_element_count = 0;
  local_2b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_2b0._M_rehash_policy._4_4_ = 0;
  local_278.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_260.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_260.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_260.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b0._M_rehash_policy._M_next_resize = 0;
  local_2b0._M_single_bucket = (__node_base_ptr)0x0;
  local_428._8_8_ = &local_3f0;
  local_468._0_8_ = local_c0;
  local_458._0_8_ = (pointer)0x0;
  local_458._8_8_ = 0;
  auStack_448._0_8_ = 0;
  auStack_448._8_8_ = (pointer)0x0;
  local_438._M_p = (pointer)0x0;
  pKStack_430 = (pointer)0x0;
  local_428[0] = true;
  _Stack_418._M_p = (pointer)0x1;
  local_410._M_nxt = (_Hash_node_base *)0x0;
  aStack_408._M_allocated_capacity = 0;
  aStack_408._8_8_ = 0x3f800000;
  local_3e8._M_allocated_capacity = (size_type)local_3b8;
  _Stack_3f8._M_p = (pointer)0x0;
  local_3f0 = (__node_base_ptr)0x0;
  local_3e8._8_8_ = 1;
  local_3d8._M_nxt = (_Hash_node_base *)0x0;
  sStack_3d0 = 0;
  local_3c8._M_max_load_factor = 1.0;
  local_3c8._4_4_ = 0;
  local_3c8._M_next_resize = 0;
  local_3b8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cxxopts::OptionParser::parse((ParseResult *)local_210,(OptionParser *)local_468,argc,argv);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_3e8);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_428 + 8));
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)(auStack_448 + 8));
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_458);
  cxxopts::ParseResult::operator=((ParseResult *)local_2e8,(ParseResult *)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_170);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_188);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_1a0);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1d8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_210);
  local_468._0_8_ = (Options *)local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"testrun","");
  this_00 = cxxopts::ParseResult::operator[]((ParseResult *)local_2e8,(string *)local_468);
  pTVar7 = local_470;
  pbVar4 = cxxopts::OptionValue::as<bool>(this_00);
  pTVar7->testrun = *pbVar4;
  if ((Options *)local_468._0_8_ != (Options *)local_458) {
    operator_delete((void *)local_468._0_8_,(ulong)(local_458._0_8_ + 1));
  }
  local_468._0_8_ = (Options *)local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"help","");
  sVar5 = cxxopts::ParseResult::count((ParseResult *)local_2e8,(string *)local_468);
  if ((Options *)local_468._0_8_ != (Options *)local_458) {
    operator_delete((void *)local_468._0_8_,(ulong)(local_458._0_8_ + 1));
  }
  if (sVar5 == 0) {
    local_468._0_8_ = (Options *)local_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"version","");
    sVar5 = cxxopts::ParseResult::count((ParseResult *)local_2e8,(string *)local_468);
    testrun = extraout_DL;
    if ((Options *)local_468._0_8_ != (Options *)local_458) {
      operator_delete((void *)local_468._0_8_,(ulong)(local_458._0_8_ + 1));
      testrun = extraout_DL_00;
    }
    if (sVar5 == 0) {
      if (local_248.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_248.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_468._0_8_ = local_158._0_8_;
        local_468._8_8_ = local_158._8_8_;
        pTVar7 = (Tools *)&std::cerr;
        format_str_01.size_ = 0x15;
        format_str_01.data_ = "{}: Missing command.\n";
        args_02.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_468;
        args_02.desc_ = 0xd;
        ::fmt::v10::vprint<char>
                  ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,format_str_01,args_02)
        ;
      }
      else {
        local_458._0_8_ = argv[1];
        if (*(char *)&(((pointer)local_458._0_8_)->m_key)._M_dataplus._M_p == '-') {
          local_458._0_8_ =
               ((local_248.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          local_458._8_8_ =
               (local_248.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
          local_468._0_8_ = local_158._0_8_;
          local_468._8_8_ = local_158._8_8_;
          pTVar7 = (Tools *)&std::cerr;
          format_str_00.size_ = 0x20;
          format_str_00.data_ = "{}: Unrecognized argument: \"{}\"\n";
          args_01.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_468;
          args_01.desc_ = 0xdd;
          ::fmt::v10::vprint<char>
                    ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,format_str_00,
                     args_01);
        }
        else {
          local_468._0_8_ = local_158._0_8_;
          local_468._8_8_ = local_158._8_8_;
          pTVar7 = (Tools *)&std::cerr;
          format_str_02.size_ = 0x1f;
          format_str_02.data_ = "{}: Unrecognized command: \"{}\"\n";
          args_03.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_468;
          args_03.desc_ = 0xcd;
          ::fmt::v10::vprint<char>
                    ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,format_str_02,
                     args_03);
        }
      }
      iVar6 = 1;
      printUsage(pTVar7,(ostream *)&std::cerr,(Options *)local_158);
    }
    else {
      version_abi_cxx11_((string *)local_210,(ktx *)(ulong)pTVar7->testrun,(bool)testrun);
      local_468._0_8_ = local_158._0_8_;
      local_468._8_8_ = local_158._8_8_;
      local_458._0_8_ = local_210._0_8_;
      local_458._8_8_ = local_210._8_8_;
      fmt.size_ = 0xf;
      fmt.data_ = "{} version: {}\n";
      args_04.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_468;
      args_04.desc_ = 0xdd;
      ::fmt::v10::vprint(fmt,args_04);
      if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
      iVar6 = 0;
    }
  }
  else {
    local_468._0_8_ = local_158._0_8_;
    local_468._8_8_ = local_158._8_8_;
    pTVar7 = (Tools *)&std::cout;
    format_str.size_ = 0x61;
    format_str.data_ =
         "{}: Unified CLI frontend for the KTX-Software library with sub-commands for specific operations.\n"
    ;
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_468;
    args_00.desc_ = 0xd;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str,args_00);
    iVar6 = 0;
    printUsage(pTVar7,(ostream *)&std::cout,(Options *)local_158);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&vStack_260);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_278);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2b0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_2e8);
  cxxopts::Options::~Options((Options *)local_158);
  return iVar6;
}

Assistant:

int Tools::main(int argc, char* argv[]) {
    cxxopts::Options options("ktx", "");
    options.custom_help("[<command>] [OPTION...]");
    options.set_width(CONSOLE_USAGE_WIDTH);
    options.add_options()
            ("h,help", "Print this usage message and exit")
            ("v,version", "Print the version number of this program and exit")
            ("testrun", "Indicates test run. If enabled the tool will produce deterministic output whenever possible");

    options.allow_unrecognised_options();

    cxxopts::ParseResult args;
    try {
        args = options.parse(argc, argv);
    } catch (const std::exception& ex) {
        fmt::print(std::cerr, "{}: {}\n", options.program(), ex.what());
        printUsage(std::cerr, options);
        return +rc::INVALID_ARGUMENTS;
    }

    testrun = args["testrun"].as<bool>();

    if (args.count("help")) {
        fmt::print(std::cout, "{}: Unified CLI frontend for the KTX-Software library with sub-commands for specific operations.\n", options.program());
        printUsage(std::cout, options);
        return +rc::SUCCESS;
    }

    if (args.count("version")) {
        fmt::print("{} version: {}\n", options.program(), version(testrun));
        return +rc::SUCCESS;
    }

    if (args.unmatched().empty()) {
        fmt::print(std::cerr, "{}: Missing command.\n", options.program());
        printUsage(std::cerr, options);
    } else {
        if (argv[1][0] != '-') {
            fmt::print(std::cerr, "{}: Unrecognized command: \"{}\"\n", options.program(), argv[1]);
        } else {
            fmt::print(std::cerr, "{}: Unrecognized argument: \"{}\"\n", options.program(), args.unmatched()[0]);
        }
        printUsage(std::cerr, options);
    }

    return +rc::INVALID_ARGUMENTS;
}